

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

void Abc_FrameSetJsonObjs(Vec_Wec_t *vObjs)

{
  Vec_Wec_t *vObjs_local;
  
  Vec_WecFreeP(&s_GlobalFrame->vJsonObjs);
  s_GlobalFrame->vJsonObjs = vObjs;
  return;
}

Assistant:

void        Abc_FrameSetJsonObjs( Vec_Wec_t * vObjs )        { Vec_WecFreeP(&s_GlobalFrame->vJsonObjs ); s_GlobalFrame->vJsonObjs = vObjs; }